

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O2

void pile_excise(object **pile,object *obj)

{
  object *poVar1;
  object *poVar2;
  _Bool _Var3;
  wchar_t in_ECX;
  object *extraout_RDX;
  object *extraout_RDX_00;
  object *extraout_RDX_01;
  object *extraout_RDX_02;
  object *extraout_RDX_03;
  object *poVar4;
  object *pile_00;
  object *poVar5;
  
  poVar1 = obj->prev;
  poVar2 = obj->next;
  poVar5 = *pile;
  pile_00 = obj;
  _Var3 = pile_contains(poVar5,obj);
  poVar4 = extraout_RDX;
  if (!_Var3) {
    pile_00 = obj;
    pile_integrity_fail(poVar5,obj,(char *)0xd7,in_ECX);
    poVar5 = *pile;
    poVar4 = extraout_RDX_00;
  }
  pile_check_integrity((char *)poVar5,pile_00,poVar4);
  poVar5 = *pile;
  poVar4 = extraout_RDX_01;
  if (poVar5 == obj) {
    if (poVar1 != (object *)0x0) {
      pile_00 = obj;
      pile_integrity_fail(poVar5,obj,(char *)0xde,in_ECX);
      poVar4 = extraout_RDX_03;
    }
    *pile = poVar2;
  }
  else {
    if (obj->prev == (object *)0x0) {
      pile_00 = obj;
      pile_integrity_fail(poVar5,obj,(char *)0xe4,in_ECX);
      poVar4 = extraout_RDX_02;
    }
    poVar1->next = poVar2;
    obj->prev = (object *)0x0;
  }
  if (poVar2 != (object *)0x0) {
    poVar2->prev = poVar1;
    obj->next = (object *)0x0;
  }
  pile_check_integrity((char *)*pile,pile_00,poVar4);
  return;
}

Assistant:

void pile_excise(struct object **pile, struct object *obj)
{
	struct object *prev = obj->prev;
	struct object *next = obj->next;

	if (!pile_contains(*pile, obj)) {
		pile_integrity_fail(*pile, obj, __FILE__, __LINE__);
	}
	pile_check_integrity("excise [pre]", *pile, obj);

	/* Special case: unlink top object */
	if (*pile == obj) {
		if (prev) {
			pile_integrity_fail(*pile, obj, __FILE__, __LINE__);
		}

		*pile = next;
	} else {
		if (obj->prev == NULL) {
			pile_integrity_fail(*pile, obj, __FILE__, __LINE__);
		}

		/* Otherwise unlink from the previous */
		prev->next = next;
		obj->prev = NULL;
	}

	/* And then unlink from the next */
	if (next) {
		next->prev = prev;
		obj->next = NULL;
	}

	pile_check_integrity("excise [post]", *pile, NULL);
}